

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::IfcRelAggregates(IfcRelAggregates *this)

{
  IfcRelAggregates *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcRelDecomposes).field_0xd8,"IfcRelAggregates");
  IfcRelDecomposes::IfcRelDecomposes
            (&this->super_IfcRelDecomposes,&PTR_construction_vtable_24__00e9dab8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelAggregates,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelAggregates,_0UL> *)
             &(this->super_IfcRelDecomposes).field_0xc8,&PTR_construction_vtable_24__00e9db30);
  *(undefined8 *)&this->super_IfcRelDecomposes = 0xe9da00;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xd8 = 0xe9daa0;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0x88 = 0xe9da28;
  (this->super_IfcRelDecomposes).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xe9da50;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xc8 = 0xe9da78;
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}